

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_to_hex.hpp
# Opt level: O1

char * mserialize::detail::write_integer_as_hex<int>(int v,char *end)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  if (v == 0) {
    end[-1] = '0';
    return end + -1;
  }
  if (0 < v) {
    uVar3 = (ulong)(uint)v;
    do {
      end[-1] = "0123456789ABCDEF"[v & 0xf];
      end = end + -1;
      uVar3 = uVar3 >> 4;
      bVar5 = 0xf < (uint)v;
      v = (int)uVar3;
    } while (bVar5);
    return end;
  }
  pcVar2 = end + -1;
  do {
    uVar1 = v + 0xf;
    uVar4 = v;
    if (v < 0) {
      uVar4 = uVar1;
    }
    *pcVar2 = "0123456789ABCDEF"[(uVar4 & 0xfffffff0) - v];
    v = (int)uVar4 >> 4;
    pcVar2 = pcVar2 + -1;
  } while (0x1e < uVar1);
  *pcVar2 = '-';
  return pcVar2;
}

Assistant:

constexpr char* write_integer_as_hex(Integer v, char* end)
{
  const char digits[] = "0123456789ABCDEF";

  if (v == 0)
  {
    *--end = '0';
  }
  else if (v > 0)
  {
    while (v != 0)
    {
      *--end = digits[v % 16];
      v = static_cast<Integer>(v / 16);
    }
  }
  else
  {
    while (v != 0)
    {
      *--end = digits[-(v % 16)];
      v = static_cast<Integer>(v / 16);
    }
    *--end = '-';
  }

  return end;
}